

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

double __thiscall
despot::BaseRockSample::StepReward(BaseRockSample *this,Belief *belief,ACT_TYPE action)

{
  double dVar1;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *this_00;
  size_type sVar2;
  const_reference ppSVar3;
  double dVar4;
  State *particle;
  double dStack_30;
  int i;
  double value;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles;
  ACT_TYPE action_local;
  Belief *belief_local;
  BaseRockSample *this_local;
  
  this_00 = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)
            (**(code **)(*(long *)belief + 0x30))();
  dStack_30 = 0.0;
  particle._4_4_ = 0;
  while( true ) {
    sVar2 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(this_00);
    if (sVar2 <= (ulong)(long)particle._4_4_) break;
    ppSVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (this_00,(long)particle._4_4_);
    dVar1 = *(double *)(*ppSVar3 + 0x18);
    dVar4 = (double)(**(code **)(*(long *)this + 0x28))(this,*(undefined4 *)(*ppSVar3 + 0xc),action)
    ;
    dStack_30 = dVar1 * dVar4 + dStack_30;
    particle._4_4_ = particle._4_4_ + 1;
  }
  return dStack_30;
}

Assistant:

double BaseRockSample::StepReward(const Belief* belief, ACT_TYPE action) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double value = 0;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		value += particle->weight * Reward(particle->state_id, action);
	}

	return value;
}